

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerMSL::SampledImageScanner::handle
          (SampledImageScanner *this,Op opcode,uint32_t *args,uint32_t length)

{
  CompilerMSL *pCVar1;
  bool bVar2;
  undefined4 in_EAX;
  SPIRType *pSVar3;
  bool bVar4;
  bool bVar5;
  uint32_t result_type;
  undefined4 uStack_28;
  uint local_24;
  
  if (opcode - OpImageSampleImplicitLod < 0xb) {
    pCVar1 = this->compiler;
    bVar5 = true;
    bVar2 = true;
    if (pCVar1->has_sampled_images == false) {
      pSVar3 = Compiler::expression_type((Compiler *)pCVar1,args[2]);
      bVar2 = Compiler::is_sampled_image_type((Compiler *)pCVar1,pSVar3);
    }
    pCVar1 = this->compiler;
    pCVar1->has_sampled_images = bVar2;
    bVar4 = true;
    if (pCVar1->needs_swizzle_buffer_def == false) {
      bVar4 = bVar2;
    }
    pCVar1->needs_swizzle_buffer_def = bVar4;
  }
  else {
    bVar5 = true;
    if ((opcode - OpLoad < 0x28) && ((0x8002000001U >> ((ulong)(opcode - OpLoad) & 0x3f) & 1) != 0))
    {
      if (length < 3) {
        bVar5 = false;
      }
      else {
        _uStack_28 = CONCAT44(*args,in_EAX);
        pSVar3 = Variant::get<spirv_cross::SPIRType>
                           ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr + *args);
        if (((pSVar3->basetype & ~Void) == Image) && ((pSVar3->image).sampled == 1)) {
          uStack_28 = CONCAT13(1,(undefined3)uStack_28);
          Compiler::set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
                    ((Compiler *)this->compiler,args[1],(char (*) [1])0x2f08f5,&local_24,
                     (bool *)((long)&uStack_28 + 3));
        }
      }
    }
  }
  return bVar5;
}

Assistant:

bool CompilerMSL::SampledImageScanner::handle(spv::Op opcode, const uint32_t *args, uint32_t length)
{
	switch (opcode)
	{
	case OpLoad:
	case OpImage:
	case OpSampledImage:
	{
		if (length < 3)
			return false;

		uint32_t result_type = args[0];
		auto &type = compiler.get<SPIRType>(result_type);
		if ((type.basetype != SPIRType::Image && type.basetype != SPIRType::SampledImage) || type.image.sampled != 1)
			return true;

		uint32_t id = args[1];
		compiler.set<SPIRExpression>(id, "", result_type, true);
		break;
	}
	case OpImageSampleExplicitLod:
	case OpImageSampleProjExplicitLod:
	case OpImageSampleDrefExplicitLod:
	case OpImageSampleProjDrefExplicitLod:
	case OpImageSampleImplicitLod:
	case OpImageSampleProjImplicitLod:
	case OpImageSampleDrefImplicitLod:
	case OpImageSampleProjDrefImplicitLod:
	case OpImageFetch:
	case OpImageGather:
	case OpImageDrefGather:
		compiler.has_sampled_images =
		    compiler.has_sampled_images || compiler.is_sampled_image_type(compiler.expression_type(args[2]));
		compiler.needs_swizzle_buffer_def = compiler.needs_swizzle_buffer_def || compiler.has_sampled_images;
		break;
	default:
		break;
	}
	return true;
}